

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

float WeatherQNHfromMETAR(string *metar)

{
  bool bVar1;
  ParseResult *pPVar2;
  const_iterator this;
  const_iterator cVar3;
  add_pointer_t<const_metaf::PressureGroup> this_00;
  float fVar4;
  Pressure PVar5;
  PressureGroup *pPg;
  GroupInfo *gi;
  const_iterator __end2;
  const_iterator __begin2;
  vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_> *__range2;
  ParseResult *r;
  vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Unit unit;
  
  pPVar2 = ParseMETAR((string *)__begin2._M_current);
  if ((pPVar2->reportMetadata).error == NONE) {
    this = std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>::begin
                     (in_stack_ffffffffffffff88);
    cVar3 = std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>::end
                      (in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              (__normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
      ::operator*((__normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
                   *)&stack0xffffffffffffffd8);
      this_00 = std::
                get_if<metaf::PressureGroup,metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
                          ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                            *)0x23a466);
      unit = (Unit)((ulong)cVar3._M_current >> 0x20);
      if (this_00 != (add_pointer_t<const_metaf::PressureGroup>)0x0) {
        PVar5 = metaf::PressureGroup::atmosphericPressure(this_00);
        metaf::Pressure::toUnit((Pressure *)this._M_current,unit);
        fVar4 = std::optional<float>::value_or<float>
                          ((optional<float> *)
                           PVar5.pressureValue.super__Optional_base<float,_true,_true>._M_payload.
                           super__Optional_payload_base<float>.
                           super__Optional_base<float,_true,_true>,
                           (float *)CONCAT44(0x7fc00000,in_stack_ffffffffffffff90));
        return fVar4;
      }
      __gnu_cxx::
      __normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
      ::operator++((__normal_iterator<const_metaf::GroupInfo_*,_std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>_>
                    *)&stack0xffffffffffffffd8);
    }
  }
  return NAN;
}

Assistant:

float WeatherQNHfromMETAR (const std::string& metar)
{
    // --- Parse ---
    const ParseResult& r = ParseMETAR(metar);
    if (r.reportMetadata.error == ReportError::NONE) {
        // Find the pressure group
        for (const GroupInfo& gi: r.groups)
            if (const PressureGroup *pPg = std::get_if<PressureGroup>(&gi.group))
                return pPg->atmosphericPressure().toUnit(Pressure::Unit::HECTOPASCAL).value_or(NAN);
    }
    return NAN;
}